

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O3

void __thiscall
duckdb::SelectionVector::Initialize(SelectionVector *this,buffer_ptr<SelectionData> *data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  SelectionData *pSVar3;
  
  peVar1 = (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (data->internal).super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->selection_data).internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->selection_data).internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pSVar3 = shared_ptr<duckdb::SelectionData,_true>::operator->(&this->selection_data);
  this->sel_vector = (sel_t *)(pSVar3->owned_data).pointer;
  return;
}

Assistant:

void Initialize(buffer_ptr<SelectionData> data) {
		selection_data = std::move(data);
		sel_vector = reinterpret_cast<sel_t *>(selection_data->owned_data.get());
	}